

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

size_t __thiscall efsw::String::find_first_not_of(String *this,StringBaseType c,size_t pos)

{
  size_t sVar1;
  
  for (; (sVar1 = 0xffffffffffffffff, pos < (this->mString)._M_string_length &&
         (sVar1 = pos, (this->mString)._M_dataplus._M_p[pos] == c)); pos = pos + 1) {
  }
  return sVar1;
}

Assistant:

std::size_t String::find_first_not_of( StringBaseType c, std::size_t pos ) const {
	return mString.find_first_not_of( c, pos );
}